

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

int __thiscall
absl::synchronization_internal::GraphCycles::GetStackTrace(GraphCycles *this,GraphId id,void ***ptr)

{
  Node *pNVar1;
  int iVar2;
  void **ppvVar3;
  
  pNVar1 = (this->rep_->nodes_).ptr_[id.handle & 0xffffffff];
  ppvVar3 = (void **)0x0;
  iVar2 = 0;
  if ((pNVar1 != (Node *)0x0) && (iVar2 = 0, pNVar1->version == (uint32_t)(id.handle >> 0x20))) {
    iVar2 = pNVar1->nstack;
    ppvVar3 = pNVar1->stack;
  }
  *ptr = ppvVar3;
  return iVar2;
}

Assistant:

int GraphCycles::GetStackTrace(GraphId id, void*** ptr) {
  Node* n = FindNode(rep_, id);
  if (n == nullptr) {
    *ptr = nullptr;
    return 0;
  } else {
    *ptr = n->stack;
    return n->nstack;
  }
}